

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::failure(StdOutput *this,CmdLineInterface *_cmd,ArgException *e)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  void *pvVar4;
  ExitException *this_00;
  undefined1 local_90 [32];
  undefined1 local_70 [56];
  string progName;
  ArgException *e_local;
  CmdLineInterface *_cmd_local;
  StdOutput *this_local;
  
  iVar1 = (*_cmd->_vptr_CmdLineInterface[10])();
  std::__cxx11::string::string((string *)(local_70 + 0x30),(string *)CONCAT44(extraout_var,iVar1));
  poVar3 = std::operator<<((ostream *)&std::cerr,"PARSE ERROR: ");
  ArgException::argId_abi_cxx11_((ArgException *)local_70);
  poVar3 = std::operator<<(poVar3,(string *)local_70);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"             ");
  ArgException::error_abi_cxx11_((ArgException *)local_90);
  poVar3 = std::operator<<(poVar3,(string *)local_90);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_70);
  uVar2 = (*_cmd->_vptr_CmdLineInterface[0xf])();
  if ((uVar2 & 1) == 0) {
    (*(this->super_CmdLineOutput)._vptr_CmdLineOutput[2])(this,_cmd);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Brief USAGE: ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _shortUsage(this,_cmd,(ostream *)&std::cerr);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"For complete USAGE and HELP type: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = std::operator<<(poVar3,(string *)(local_70 + 0x30));
    poVar3 = std::operator<<(poVar3," --help");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  this_00 = (ExitException *)__cxa_allocate_exception(4);
  ExitException::ExitException(this_00,1);
  __cxa_throw(this_00,&ExitException::typeinfo,0);
}

Assistant:

inline void StdOutput::failure( CmdLineInterface& _cmd,
								ArgException& e ) 
{
	std::string progName = _cmd.getProgramName();

	std::cerr << "PARSE ERROR: " << e.argId() << std::endl
		      << "             " << e.error() << std::endl << std::endl;

	if ( _cmd.hasHelpAndVersion() )
		{
			std::cerr << "Brief USAGE: " << std::endl;

			_shortUsage( _cmd, std::cerr );	

			std::cerr << std::endl << "For complete USAGE and HELP type: " 
					  << std::endl << "   " << progName << " --help" 
					  << std::endl << std::endl;
		}
	else
		usage(_cmd);

	throw ExitException(1);
}